

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

xmlTextWriterPtr xmlNewTextWriter(xmlOutputBufferPtr out)

{
  xmlListPtr pxVar1;
  xmlBufPtr pxVar2;
  xmlDocPtr pxVar3;
  xmlTextWriterPtr ret;
  xmlOutputBufferPtr out_local;
  
  out_local = (xmlOutputBufferPtr)(*xmlMalloc)(0x50);
  if (out_local == (xmlOutputBufferPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,"xmlNewTextWriter : out of memory!\n");
    out_local = (xmlOutputBufferPtr)0x0;
  }
  else {
    memset(out_local,0,0x50);
    pxVar1 = xmlListCreate(xmlFreeTextWriterStackEntry,xmlCmpTextWriterStackEntry);
    out_local->writecallback = (xmlOutputWriteCallback)pxVar1;
    if (out_local->writecallback == (xmlOutputWriteCallback)0x0) {
      xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,"xmlNewTextWriter : out of memory!\n")
      ;
      (*xmlFree)(out_local);
      out_local = (xmlOutputBufferPtr)0x0;
    }
    else {
      pxVar1 = xmlListCreate(xmlFreeTextWriterNsStackEntry,xmlCmpTextWriterNsStackEntry);
      out_local->closecallback = (xmlOutputCloseCallback)pxVar1;
      if (out_local->closecallback == (xmlOutputCloseCallback)0x0) {
        xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,
                        "xmlNewTextWriter : out of memory!\n");
        xmlListDelete((xmlListPtr)out_local->writecallback);
        (*xmlFree)(out_local);
        out_local = (xmlOutputBufferPtr)0x0;
      }
      else {
        out_local->context = out;
        pxVar2 = (xmlBufPtr)xmlStrdup(" ");
        out_local->conv = pxVar2;
        *(undefined1 *)&out_local->written = 0x22;
        if (out_local->conv == (xmlBufPtr)0x0) {
          xmlListDelete((xmlListPtr)out_local->writecallback);
          xmlListDelete((xmlListPtr)out_local->closecallback);
          (*xmlFree)(out_local);
          xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,
                          "xmlNewTextWriter : out of memory!\n");
          out_local = (xmlOutputBufferPtr)0x0;
        }
        else {
          pxVar3 = xmlNewDoc((xmlChar *)0x0);
          out_local[1].closecallback = (xmlOutputCloseCallback)pxVar3;
          *(undefined4 *)&out_local[1].writecallback = 0;
        }
      }
    }
  }
  return (xmlTextWriterPtr)out_local;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriter(xmlOutputBufferPtr out)
{
    xmlTextWriterPtr ret;

    ret = (xmlTextWriterPtr) xmlMalloc(sizeof(xmlTextWriter));
    if (ret == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriter : out of memory!\n");
        return NULL;
    }
    memset(ret, 0, sizeof(xmlTextWriter));

    ret->nodes = xmlListCreate(xmlFreeTextWriterStackEntry,
                               xmlCmpTextWriterStackEntry);
    if (ret->nodes == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriter : out of memory!\n");
        xmlFree(ret);
        return NULL;
    }

    ret->nsstack = xmlListCreate(xmlFreeTextWriterNsStackEntry,
                                 xmlCmpTextWriterNsStackEntry);
    if (ret->nsstack == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriter : out of memory!\n");
        xmlListDelete(ret->nodes);
        xmlFree(ret);
        return NULL;
    }

    ret->out = out;
    ret->ichar = xmlStrdup(BAD_CAST " ");
    ret->qchar = '"';

    if (!ret->ichar) {
        xmlListDelete(ret->nodes);
        xmlListDelete(ret->nsstack);
        xmlFree(ret);
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriter : out of memory!\n");
        return NULL;
    }

    ret->doc = xmlNewDoc(NULL);

    ret->no_doc_free = 0;

    return ret;
}